

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

void __thiscall Graph::resetFlowAndLoss(Graph *this)

{
  Vertex *pVVar1;
  Edge *pEVar2;
  Edge **ppEVar3;
  
  while (pVVar1 = this->verticesList, pVVar1 != (Vertex *)0x0) {
    ppEVar3 = &pVVar1->edgesList;
    while (pEVar2 = *ppEVar3, pEVar2 != (Edge *)0x0) {
      pEVar2->activePowerFlow = 0.0;
      pEVar2->reactivePowerFlow = 0.0;
      pEVar2->activeLoss = 0.0;
      pEVar2->reactiveLoss = 0.0;
      ppEVar3 = &pEVar2->nextEdge;
    }
    this = (Graph *)&pVVar1->nextVertex;
  }
  return;
}

Assistant:

void Graph::resetFlowAndLoss(){
    for(Vertex *v=this->verticesList; v!=NULL; v= v->getNext()){
        for(Edge *e= v->getEdgesList(); e!=NULL; e= e->getNext()){
            e->setActiveFlow(0.0);
            e->setReactiveFlow(0.0);
            e->setActiveLoss(0.0);
            e->setReactiveLoss(0.0);
        }
    }
}